

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_meter.cpp
# Opt level: O2

void Meter::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QString *this;
  code *pcVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  QString *pQVar6;
  QColor *pQVar7;
  qreal v;
  Data *pDVar8;
  QArrayDataPointer<char16_t> QStack_28;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id != 2) {
      if (_id == 1) {
        thresholdFired((Meter *)_o,*_a[1]);
        return;
      }
      if (_id != 0) {
        return;
      }
      valueChanged((Meter *)_o,*_a[1]);
      return;
    }
    v = *_a[1];
    goto LAB_0010d33f;
  case ReadProperty:
    if (0x11 < (uint)_id) {
      return;
    }
    break;
  case WriteProperty:
    if (0x11 < (uint)_id) {
      return;
    }
    pQVar7 = (QColor *)*_a;
    switch(_id) {
    case 0:
      setMinValue((Meter *)_o,*(qreal *)pQVar7);
      return;
    case 1:
      setMaxValue((Meter *)_o,*(qreal *)pQVar7);
      return;
    case 2:
      v = *(qreal *)pQVar7;
      break;
    case 3:
      setBackgroundColor((Meter *)_o,pQVar7);
      return;
    case 4:
      setNeedleColor((Meter *)_o,pQVar7);
      return;
    case 5:
      setTextColor((Meter *)_o,pQVar7);
      return;
    case 6:
      setGridColor((Meter *)_o,pQVar7);
      return;
    case 7:
      setLabel((Meter *)_o,(QString *)pQVar7);
      return;
    case 8:
      setUnitsLabel((Meter *)_o,(QString *)pQVar7);
      return;
    case 9:
      setRadius((Meter *)_o,pQVar7->cspec);
      return;
    case 10:
      setStartScaleAngle((Meter *)_o,pQVar7->cspec);
      return;
    case 0xb:
      setStopScaleAngle((Meter *)_o,pQVar7->cspec);
      return;
    case 0xc:
      setScaleStep((Meter *)_o,*(qreal *)pQVar7);
      return;
    case 0xd:
      setScaleGridStep((Meter *)_o,*(qreal *)pQVar7);
      return;
    case 0xe:
      setDrawValue((Meter *)_o,SUB41(pQVar7->cspec,0));
      return;
    case 0xf:
      setDrawGridValues((Meter *)_o,SUB41(pQVar7->cspec,0));
      return;
    case 0x10:
      setDrawValuePrecision((Meter *)_o,pQVar7->cspec);
      return;
    case 0x11:
      setScaleLabelPrecision((Meter *)_o,pQVar7->cspec);
      return;
    }
LAB_0010d33f:
    setValue((Meter *)_o,v);
    return;
  default:
    goto switchD_0010d253_caseD_3;
  case IndexOfMethod:
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == valueChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == thresholdFired && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    goto switchD_0010d253_caseD_3;
  }
  this = (QString *)*_a;
  switch(_id) {
  case 0:
    pDVar8 = (Data *)minValue((Meter *)_o);
    break;
  case 1:
    pDVar8 = (Data *)maxValue((Meter *)_o);
    break;
  case 2:
    pDVar8 = (Data *)value((Meter *)_o);
    break;
  case 3:
    pQVar7 = backgroundColor((Meter *)_o);
    goto LAB_0010d525;
  case 4:
    pQVar7 = needleColor((Meter *)_o);
    goto LAB_0010d525;
  case 5:
    pQVar7 = textColor((Meter *)_o);
    goto LAB_0010d525;
  case 6:
    pQVar7 = gridColor((Meter *)_o);
LAB_0010d525:
    uVar3 = *(undefined8 *)((long)&pQVar7->ct + 2);
    (this->d).d = *(Data **)pQVar7;
    *(undefined8 *)((long)&(this->d).d + 6) = uVar3;
    return;
  case 7:
    pQVar6 = label((Meter *)_o);
    QString::operator=(this,pQVar6);
    return;
  case 8:
    unitsLabel((QString *)&QStack_28,(Meter *)_o);
    QString::operator=(this,(QString *)&QStack_28);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_28);
    return;
  case 9:
    uVar5 = radius((Meter *)_o);
    goto LAB_0010d53d;
  case 10:
    uVar5 = startScaleAngle((Meter *)_o);
    goto LAB_0010d53d;
  case 0xb:
    uVar5 = stopScaleAngle((Meter *)_o);
    goto LAB_0010d53d;
  case 0xc:
    pDVar8 = (Data *)scaleStep((Meter *)_o);
    break;
  case 0xd:
    pDVar8 = (Data *)scaleGridStep((Meter *)_o);
    break;
  case 0xe:
    bVar4 = drawValue((Meter *)_o);
    goto LAB_0010d497;
  case 0xf:
    bVar4 = drawGridValues((Meter *)_o);
LAB_0010d497:
    *(bool *)&(this->d).d = bVar4;
    return;
  case 0x10:
    uVar5 = drawValuePrecision((Meter *)_o);
    goto LAB_0010d53d;
  case 0x11:
    uVar5 = scaleLabelPrecision((Meter *)_o);
LAB_0010d53d:
    *(uint *)&(this->d).d = uVar5;
    return;
  }
  (this->d).d = pDVar8;
switchD_0010d253_caseD_3:
  return;
}

Assistant:

void Meter::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Meter *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 1: _t->thresholdFired((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->setValue((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Meter::*)(qreal );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Meter::valueChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (Meter::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Meter::thresholdFired)) {
                *result = 1;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<Meter *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< qreal*>(_v) = _t->minValue(); break;
        case 1: *reinterpret_cast< qreal*>(_v) = _t->maxValue(); break;
        case 2: *reinterpret_cast< qreal*>(_v) = _t->value(); break;
        case 3: *reinterpret_cast< QColor*>(_v) = _t->backgroundColor(); break;
        case 4: *reinterpret_cast< QColor*>(_v) = _t->needleColor(); break;
        case 5: *reinterpret_cast< QColor*>(_v) = _t->textColor(); break;
        case 6: *reinterpret_cast< QColor*>(_v) = _t->gridColor(); break;
        case 7: *reinterpret_cast< QString*>(_v) = _t->label(); break;
        case 8: *reinterpret_cast< QString*>(_v) = _t->unitsLabel(); break;
        case 9: *reinterpret_cast< uint*>(_v) = _t->radius(); break;
        case 10: *reinterpret_cast< uint*>(_v) = _t->startScaleAngle(); break;
        case 11: *reinterpret_cast< uint*>(_v) = _t->stopScaleAngle(); break;
        case 12: *reinterpret_cast< qreal*>(_v) = _t->scaleStep(); break;
        case 13: *reinterpret_cast< qreal*>(_v) = _t->scaleGridStep(); break;
        case 14: *reinterpret_cast< bool*>(_v) = _t->drawValue(); break;
        case 15: *reinterpret_cast< bool*>(_v) = _t->drawGridValues(); break;
        case 16: *reinterpret_cast< int*>(_v) = _t->drawValuePrecision(); break;
        case 17: *reinterpret_cast< int*>(_v) = _t->scaleLabelPrecision(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<Meter *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setMinValue(*reinterpret_cast< qreal*>(_v)); break;
        case 1: _t->setMaxValue(*reinterpret_cast< qreal*>(_v)); break;
        case 2: _t->setValue(*reinterpret_cast< qreal*>(_v)); break;
        case 3: _t->setBackgroundColor(*reinterpret_cast< QColor*>(_v)); break;
        case 4: _t->setNeedleColor(*reinterpret_cast< QColor*>(_v)); break;
        case 5: _t->setTextColor(*reinterpret_cast< QColor*>(_v)); break;
        case 6: _t->setGridColor(*reinterpret_cast< QColor*>(_v)); break;
        case 7: _t->setLabel(*reinterpret_cast< QString*>(_v)); break;
        case 8: _t->setUnitsLabel(*reinterpret_cast< QString*>(_v)); break;
        case 9: _t->setRadius(*reinterpret_cast< uint*>(_v)); break;
        case 10: _t->setStartScaleAngle(*reinterpret_cast< uint*>(_v)); break;
        case 11: _t->setStopScaleAngle(*reinterpret_cast< uint*>(_v)); break;
        case 12: _t->setScaleStep(*reinterpret_cast< qreal*>(_v)); break;
        case 13: _t->setScaleGridStep(*reinterpret_cast< qreal*>(_v)); break;
        case 14: _t->setDrawValue(*reinterpret_cast< bool*>(_v)); break;
        case 15: _t->setDrawGridValues(*reinterpret_cast< bool*>(_v)); break;
        case 16: _t->setDrawValuePrecision(*reinterpret_cast< int*>(_v)); break;
        case 17: _t->setScaleLabelPrecision(*reinterpret_cast< int*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}